

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_platform_compatibility_check(void)

{
  mcpl_particle_t pd;
  int64_t not0_64;
  int64_t m1_64;
  int32_t not0_32;
  int32_t m1_32;
  
  return;
}

Assistant:

MCPL_LOCAL void mcpl_platform_compatibility_check(void) {
  MCPL_STATIC_ASSERT(CHAR_BIT==8);
  MCPL_STATIC_ASSERT(sizeof(float)==4);
  MCPL_STATIC_ASSERT(sizeof(double)==8);

  int32_t m1_32 = -1;
  int32_t not0_32 = ~((int32_t)0);
  int64_t m1_64 = -1;
  int64_t not0_64 = ~((int64_t)0);
  if ( m1_32 != not0_32 || m1_64 != not0_64 )
    mcpl_error("Platform compatibility check failed (integers are not two's complement)");

  if (copysign(1.0, -0.0) != -1.0)
    mcpl_error("Platform compatibility check failed (floating point numbers do not have signed zero)");

  mcpl_particle_t pd;
  if ( (char*)&(pd.userflags)-(char*)&(pd) != 12*sizeof(double)+sizeof(uint32_t) )
    mcpl_error("Platform compatibility check failed (unexpected padding in mcpl_particle_t)");
}